

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O0

void __thiscall Tle::Tle(Tle *this,Tle *tle)

{
  Tle *tle_local;
  Tle *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->line_one_);
  std::__cxx11::string::string((string *)&this->line_two_);
  std::__cxx11::string::string((string *)&this->int_designator_);
  DateTime::DateTime(&this->epoch_);
  std::__cxx11::string::operator=((string *)this,(string *)tle);
  std::__cxx11::string::operator=((string *)&this->line_one_,(string *)&tle->line_one_);
  std::__cxx11::string::operator=((string *)&this->line_two_,(string *)&tle->line_two_);
  this->norad_number_ = tle->norad_number_;
  std::__cxx11::string::operator=((string *)&this->int_designator_,(string *)&tle->int_designator_);
  (this->epoch_).m_encoded = (tle->epoch_).m_encoded;
  this->mean_motion_dt2_ = tle->mean_motion_dt2_;
  this->mean_motion_ddt6_ = tle->mean_motion_ddt6_;
  this->bstar_ = tle->bstar_;
  this->inclination_ = tle->inclination_;
  this->right_ascending_node_ = tle->right_ascending_node_;
  this->eccentricity_ = tle->eccentricity_;
  this->argument_perigee_ = tle->argument_perigee_;
  this->mean_anomaly_ = tle->mean_anomaly_;
  this->mean_motion_ = tle->mean_motion_;
  this->orbit_number_ = tle->orbit_number_;
  return;
}

Assistant:

Tle(const Tle& tle)
    {
        name_ = tle.name_;
        line_one_ = tle.line_one_;
        line_two_ = tle.line_two_;

        norad_number_ = tle.norad_number_;
        int_designator_ = tle.int_designator_;
        epoch_ = tle.epoch_;
        mean_motion_dt2_ = tle.mean_motion_dt2_;
        mean_motion_ddt6_ = tle.mean_motion_ddt6_;
        bstar_ = tle.bstar_;
        inclination_ = tle.inclination_;
        right_ascending_node_ = tle.right_ascending_node_;
        eccentricity_ = tle.eccentricity_;
        argument_perigee_ = tle.argument_perigee_;
        mean_anomaly_ = tle.mean_anomaly_;
        mean_motion_ = tle.mean_motion_;
        orbit_number_ = tle.orbit_number_;
    }